

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileImporter::Q3BSPFileImporter(Q3BSPFileImporter *this)

{
  Q3BSPFileImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0100d6e8;
  this->m_pCurrentMesh = (aiMesh *)0x0;
  this->m_pCurrentFace = (aiFace *)0x0;
  memset(&this->m_MaterialLookupMap,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
  ::map(&this->m_MaterialLookupMap);
  memset(&this->mTextures,0,0x18);
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::vector(&this->mTextures);
  return;
}

Assistant:

Q3BSPFileImporter::Q3BSPFileImporter()
: m_pCurrentMesh( nullptr )
, m_pCurrentFace(nullptr)
, m_MaterialLookupMap()
, mTextures() {
    // empty
}